

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_18(QPDF *pdf,char *arg2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  QPDFWriter local_80 [8];
  QPDFWriter w;
  QPDFObjGen local_70;
  QPDFObjGen local_68;
  QPDFObjectHandle local_60 [2];
  QPDFObjectHandle local_40;
  undefined1 local_30 [8];
  QPDFObjectHandle page5;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  page5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDF::getAllPages();
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     page5.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar2 != 10) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,800,"void test_18(QPDF &, const char *)");
  }
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                      page5.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,5
                     );
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_30,pvVar3);
  QPDFObjectHandle::QPDFObjectHandle(&local_40,(QPDFObjectHandle *)local_30);
  QPDF::removePage((QPDFObjectHandle *)pdf);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     page5.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar2 != 9) {
    __assert_fail("pages.size() == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x323,"void test_18(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFObjectHandle(local_60,(QPDFObjectHandle *)local_30);
  QPDF::addPage((QPDFObjectHandle *)pdf,SUB81(local_60,0));
  QPDFObjectHandle::~QPDFObjectHandle(local_60);
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     page5.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if (sVar2 != 10) {
    __assert_fail("pages.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x325,"void test_18(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::back
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             page5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  local_68 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  local_70 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_68,&local_70);
  if (!bVar1) {
    __assert_fail("pages.back().getObjGen() == page5.getObjGen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x326,"void test_18(QPDF &, const char *)");
  }
  QPDFWriter::QPDFWriter(local_80,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_80,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_80);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_80);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

static void
test_18(QPDF& pdf, char const* arg2)
{
    // Remove a page and re-insert it in the same file.
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();

    // Remove pages from various places, checking to make sure
    // that our pages reference is getting updated.
    assert(pages.size() == 10);
    QPDFObjectHandle page5 = pages.at(5);
    pdf.removePage(page5);
    assert(pages.size() == 9);
    pdf.addPage(page5, false);
    assert(pages.size() == 10);
    assert(pages.back().getObjGen() == page5.getObjGen());

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}